

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

int __thiscall
ProjectBuilderMakefileGenerator::pbuilderVersion(ProjectBuilderMakefileGenerator *this)

{
  long lVar1;
  bool bVar2;
  ProString *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  bool *ok;
  QMakeProject *this_00;
  int local_9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMakeProject **)&in_RDI[4].m_offset;
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
  bVar2 = QMakeProject::isEmpty(this_00,(ProKey *)in_RDI);
  ProKey::~ProKey((ProKey *)0x1337f0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_9c = 0x2e;
  }
  else {
    ok = *(bool **)&in_RDI[4].m_offset;
    ProKey::ProKey((ProKey *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28);
    QMakeEvaluator::first(&this_00->super_QMakeEvaluator,(ProKey *)in_RDI);
    local_9c = ProString::toInt(in_RDI,ok,in_stack_ffffffffffffff34);
    ProString::~ProString((ProString *)0x133851);
    ProKey::~ProKey((ProKey *)0x13385b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9c;
  }
  __stack_chk_fail();
}

Assistant:

int
ProjectBuilderMakefileGenerator::pbuilderVersion() const
{
    if (!project->isEmpty("QMAKE_PBUILDER_VERSION"))
        return project->first("QMAKE_PBUILDER_VERSION").toInt();
    return 46; // Xcode 3.2-compatible; default format since that version
}